

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void Catch::writeCounts(JsonObjectWriter *writer,Counts *counts)

{
  int __fd;
  JsonValueWriter local_1b0;
  
  __fd = (int)writer;
  JsonObjectWriter::write((JsonObjectWriter *)&local_1b0,__fd,"passed",6);
  JsonValueWriter::write<unsigned_long>(&local_1b0,&counts->passed);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b0.m_sstream);
  JsonObjectWriter::write((JsonObjectWriter *)&local_1b0,__fd,"failed",6);
  JsonValueWriter::write<unsigned_long>(&local_1b0,&counts->failed);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b0.m_sstream);
  JsonObjectWriter::write((JsonObjectWriter *)&local_1b0,__fd,"fail-but-ok",0xb);
  JsonValueWriter::write<unsigned_long>(&local_1b0,&counts->failedButOk);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b0.m_sstream);
  JsonObjectWriter::write((JsonObjectWriter *)&local_1b0,__fd,"skipped",7);
  JsonValueWriter::write<unsigned_long>(&local_1b0,&counts->skipped);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b0.m_sstream);
  return;
}

Assistant:

static void writeCounts( JsonObjectWriter&& writer, Counts const& counts ) {
        writer.write( "passed"_sr ).write( counts.passed );
        writer.write( "failed"_sr ).write( counts.failed );
        writer.write( "fail-but-ok"_sr ).write( counts.failedButOk );
        writer.write( "skipped"_sr ).write( counts.skipped );
    }